

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

Float AdaptiveSimpson(function<float_(float)> *f,Float x0,Float x1,Float eps,int depth)

{
  undefined8 in_RDI;
  float in_XMM0_Da;
  float __args_5;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  Float I;
  Float fc;
  Float fb;
  Float fa;
  Float c;
  Float b;
  Float a;
  function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> integrate;
  int count;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  _Any_data *this;
  _Any_data local_1c;
  float local_c;
  
  local_1c._0_4_ = 0;
  this = &local_1c;
  local_1c._12_4_ = in_XMM1_Da;
  local_c = in_XMM0_Da;
  std::function<float(float,float,float,float,float,float,float,float,int)>::
  function<AdaptiveSimpson(std::function<float(float)>const&,float,float,float,int)::__0,void>
            ((function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (anon_class_24_3_8437e47f *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  fVar2 = (local_c + (float)local_1c._12_4_) * 0.5;
  __args_5 = std::function<float_(float)>::operator()
                       ((function<float_(float)> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff6c);
  fVar1 = std::function<float_(float)>::operator()
                    ((function<float_(float)> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  std::function<float_(float)>::operator()
            ((function<float_(float)> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar1),ZEXT416((uint)__args_5));
  fVar2 = std::function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>::
          operator()((function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>
                      *)this,(float)((ulong)in_RDI >> 0x20),(float)in_RDI,local_c,fVar2,
                     (float)local_1c._12_4_,__args_5,in_stack_ffffffffffffff94,
                     in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  std::function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>::~function
            ((function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)> *)
             0x4f4b3e);
  return fVar2;
}

Assistant:

Float AdaptiveSimpson(const std::function<Float(Float)>& f, Float x0, Float x1,
                      Float eps = 1e-6f, int depth = 6) {
    int count = 0;
    /* Define an recursive lambda function for integration over subintervals */
    std::function<Float(Float, Float, Float, Float, Float, Float, Float, Float, int)>
        integrate = [&](Float a, Float b, Float c, Float fa, Float fb, Float fc, Float I,
                        Float eps, int depth) {
            /* Evaluate the function at two intermediate points */
            Float d = 0.5f * (a + b), e = 0.5f * (b + c), fd = f(d), fe = f(e);

            /* Simpson integration over each subinterval */
            Float h = c - a, I0 = (Float)(1.0 / 12.0) * h * (fa + 4 * fd + fb),
                  I1 = (Float)(1.0 / 12.0) * h * (fb + 4 * fe + fc), Ip = I0 + I1;
            ++count;

            /* Stopping criterion from J.N. Lyness (1969)
              "Notes on the adaptive Simpson quadrature routine" */
            if (depth <= 0 || std::abs(Ip - I) < 15 * eps) {
                // Richardson extrapolation
                return Ip + (Float)(1.0 / 15.0) * (Ip - I);
            }

            return integrate(a, d, b, fa, fd, fb, I0, .5f * eps, depth - 1) +
                   integrate(b, e, c, fb, fe, fc, I1, .5f * eps, depth - 1);
        };
    Float a = x0, b = 0.5f * (x0 + x1), c = x1;
    Float fa = f(a), fb = f(b), fc = f(c);
    Float I = (c - a) * (Float)(1.0 / 6.0) * (fa + 4 * fb + fc);
    return integrate(a, b, c, fa, fb, fc, I, eps, depth);
}